

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_finishset(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  Table *t_00;
  Table *local_78;
  Table *local_70;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  Table *h;
  TValue *tm;
  TValue *pTStack_30;
  int loop;
  TValue *slot_local;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  tm._4_4_ = 0;
  pTStack_30 = slot;
  key_local = t;
  do {
    if (1999 < tm._4_4_) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
    if (pTStack_30 == (TValue *)0x0) {
      h = (Table *)luaT_gettmbyobj(L,key_local,TM_NEWINDEX);
      if (*(LuaType *)&h->tt == 0) {
        luaG_typeerror(L,key_local,"index");
      }
    }
    else {
      if (key_local->tt_ != 0x8005) {
        __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x104,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (((key_local->value_).gc)->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x104,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      t_00 = (Table *)(key_local->value_).gc;
      if (pTStack_30->tt_ != 0) {
        __assert_fail("((((slot))->tt_) == (0))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x105,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (t_00->metatable == (Table *)0x0) {
        local_70 = (Table *)0x0;
      }
      else {
        if ((t_00->metatable->flags & 2) == 0) {
          local_78 = (Table *)luaT_gettm(t_00->metatable,TM_NEWINDEX,L->l_G->tmname[1]);
        }
        else {
          local_78 = (Table *)0x0;
        }
        local_70 = local_78;
      }
      h = local_70;
      if (local_70 == (Table *)0x0) {
        if (pTStack_30 == &luaO_nilobject_) {
          pTStack_30 = luaH_newkey(L,t_00,key);
        }
        pTStack_30->value_ = val->value_;
        pTStack_30->tt_ = val->tt_;
        if ((pTStack_30->tt_ & 0x8000) != 0) {
          if ((pTStack_30->tt_ & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x10b,
                          "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                         );
          }
          if ((pTStack_30->tt_ & 0x7f) != (ushort)((pTStack_30->value_).gc)->tt) {
LAB_0015d35d:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x10b,
                          "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                         );
          }
          if (L != (lua_State *)0x0) {
            if ((pTStack_30->tt_ & 0x8000) == 0) {
              __assert_fail("(((io1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0x10b,
                            "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                           );
            }
            if ((((pTStack_30->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
            goto LAB_0015d35d;
          }
        }
        t_00->flags = '\0';
        if ((val->tt_ & 0x8000) == 0) {
          return;
        }
        if (9 < (t_00->tt & 0xf)) {
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x10d,
                        "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        if ((val->tt_ & 0x8000) != 0) {
          if ((((val->value_).gc)->marked & 0x18) == 0) {
            return;
          }
          if ((t_00->tt & 0xf) < 10) {
            luaC_barrierback_(L,(GCObject *)t_00);
            return;
          }
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x10d,
                        "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        __assert_fail("(((val)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x10d,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
    }
    uVar1._0_1_ = h->tt;
    uVar1._1_1_ = h->marked;
    if ((uVar1 & 0xf) == 6) {
      luaT_callTM(L,(TValue *)h,key_local,key,val,0);
      return;
    }
    key_local = (TValue *)h;
    uVar2._0_1_ = h->tt;
    uVar2._1_1_ = h->marked;
    if ((uVar2 & 0xf) == 5) {
      sVar3._0_1_ = h->tt;
      sVar3._1_1_ = h->marked;
      if (sVar3 != -0x7ffb) {
        __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x11c,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (h->next->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x11c,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      pTStack_30 = luaH_get((Table *)h->next,key);
      if (pTStack_30->tt_ != 0) {
        pTStack_30->value_ = val->value_;
        pTStack_30->tt_ = val->tt_;
        if ((pTStack_30->tt_ & 0x8000) != 0) {
          if ((pTStack_30->tt_ & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x11d,
                          "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                         );
          }
          if ((pTStack_30->tt_ & 0x7f) != (ushort)((pTStack_30->value_).gc)->tt) {
LAB_0015d693:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x11d,
                          "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                         );
          }
          if (L != (lua_State *)0x0) {
            if ((pTStack_30->tt_ & 0x8000) == 0) {
              __assert_fail("(((io1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0x11d,
                            "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                           );
            }
            if ((((pTStack_30->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
            goto LAB_0015d693;
          }
        }
        if ((val->tt_ & 0x8000) == 0) {
          return;
        }
        uVar4._0_1_ = h->tt;
        uVar4._1_1_ = h->marked;
        if ((uVar4 & 0x8000) == 0) {
          __assert_fail("(((t)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x11d,
                        "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        if ((h->next->marked & 0x20) == 0) {
          return;
        }
        if ((val->tt_ & 0x8000) != 0) {
          if ((((val->value_).gc)->marked & 0x18) == 0) {
            return;
          }
          uVar5._0_1_ = h->tt;
          uVar5._1_1_ = h->marked;
          if ((uVar5 & 0x8000) != 0) {
            luaC_barrierback_(L,h->next);
            return;
          }
          __assert_fail("(((t)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x11d,
                        "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        __assert_fail("(((val)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x11d,
                      "void luaV_finishset(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
    }
    else {
      pTStack_30 = (TValue *)0x0;
    }
    tm._4_4_ = tm._4_4_ + 1;
  } while( true );
}

Assistant:

void luaV_finishset (lua_State *L, const TValue *t, TValue *key,
                     StkId val, const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;  /* '__newindex' metamethod */
    if (slot != NULL) {  /* is 't' a table? */
      Table *h = hvalue(t);  /* save 't' table */
      lua_assert(ttisnil(slot));  /* old value must be nil */
      tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
      if (tm == NULL) {  /* no metamethod? */
        if (slot == luaO_nilobject)  /* no previous entry? */
          slot = luaH_newkey(L, h, key);  /* create one */
        /* no metamethod and (now) there is an entry with given key */
        setobj2t(L, cast(TValue *, slot), val);  /* set its new value */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else {  /* not a table; check metamethod */
      if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
        luaG_typeerror(L, t, "index");
    }
    /* try the metamethod */
    if (ttisfunction(tm)) {
      luaT_callTM(L, tm, t, key, val, 0);
      return;
    }
    t = tm;  /* else repeat assignment over 'tm' */
    if (luaV_fastget(L, t, key, slot, luaH_get)) {
      luaV_finishfastset(L, t, slot, val);
      return;  /* done */
    }
    /* else 'return luaV_finishset(L, t, key, val, slot)' (loop) */
  }
  luaG_runerror(L, "'__newindex' chain too long; possible loop");
}